

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_nv_array_copy(nghttp2_nv **nva_ptr,nghttp2_nv *nva,size_t nvlen,nghttp2_mem *mem)

{
  byte bVar1;
  size_t sVar2;
  uint8_t *puVar3;
  nghttp2_nv *pnVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  nghttp2_nv *__dest;
  
  if (nvlen == 0) {
    *nva_ptr = (nghttp2_nv *)0x0;
  }
  else {
    puVar3 = &nva->flags;
    lVar7 = 0;
    sVar6 = nvlen;
    do {
      if ((*puVar3 & 2) == 0) {
        lVar7 = lVar7 + *(size_t *)(puVar3 + -0x10) + 1;
      }
      if ((*puVar3 & 4) == 0) {
        lVar7 = lVar7 + *(size_t *)(puVar3 + -8) + 1;
      }
      puVar3 = puVar3 + 0x28;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
    pnVar4 = (nghttp2_nv *)nghttp2_mem_malloc(mem,lVar7 + nvlen * 0x28);
    *nva_ptr = pnVar4;
    if (pnVar4 == (nghttp2_nv *)0x0) {
      return -0x385;
    }
    __dest = pnVar4 + nvlen;
    lVar7 = 0;
    do {
      bVar1 = (&nva->flags)[lVar7];
      (&pnVar4->flags)[lVar7] = bVar1;
      if ((bVar1 & 2) == 0) {
        sVar2 = *(size_t *)((long)&nva->namelen + lVar7);
        if (sVar2 == 0) {
          lVar5 = 0;
        }
        else {
          memcpy(__dest,*(void **)((long)&nva->name + lVar7),sVar2);
          lVar5 = *(long *)((long)&nva->namelen + lVar7);
        }
        *(nghttp2_nv **)((long)&pnVar4->name + lVar7) = __dest;
        *(long *)((long)&pnVar4->namelen + lVar7) = lVar5;
        *(undefined1 *)((long)&__dest->name + lVar5) = 0;
        nghttp2_downcase(*(uint8_t **)((long)&pnVar4->name + lVar7),
                         *(size_t *)((long)&pnVar4->namelen + lVar7));
        __dest = (nghttp2_nv *)((long)&__dest->name + *(long *)((long)&nva->namelen + lVar7) + 1);
        bVar1 = (&nva->flags)[lVar7];
      }
      else {
        *(undefined8 *)((long)&pnVar4->name + lVar7) = *(undefined8 *)((long)&nva->name + lVar7);
        *(undefined8 *)((long)&pnVar4->namelen + lVar7) =
             *(undefined8 *)((long)&nva->namelen + lVar7);
      }
      if ((bVar1 & 4) == 0) {
        sVar2 = *(size_t *)((long)&nva->valuelen + lVar7);
        if (sVar2 == 0) {
          lVar5 = 0;
        }
        else {
          memcpy(__dest,*(void **)((long)&nva->value + lVar7),sVar2);
          lVar5 = *(long *)((long)&nva->valuelen + lVar7);
        }
        *(nghttp2_nv **)((long)&pnVar4->value + lVar7) = __dest;
        *(long *)((long)&pnVar4->valuelen + lVar7) = lVar5;
        *(undefined1 *)((long)&__dest->name + lVar5) = 0;
        __dest = (nghttp2_nv *)((long)&__dest->name + *(long *)((long)&nva->valuelen + lVar7) + 1);
      }
      else {
        *(undefined8 *)((long)&pnVar4->value + lVar7) = *(undefined8 *)((long)&nva->value + lVar7);
        *(undefined8 *)((long)&pnVar4->valuelen + lVar7) =
             *(undefined8 *)((long)&nva->valuelen + lVar7);
      }
      lVar7 = lVar7 + 0x28;
      nvlen = nvlen - 1;
    } while (nvlen != 0);
  }
  return 0;
}

Assistant:

int nghttp2_nv_array_copy(nghttp2_nv **nva_ptr, const nghttp2_nv *nva,
                          size_t nvlen, nghttp2_mem *mem) {
  size_t i;
  uint8_t *data = NULL;
  size_t buflen = 0;
  nghttp2_nv *p;

  if (nvlen == 0) {
    *nva_ptr = NULL;

    return 0;
  }

  for (i = 0; i < nvlen; ++i) {
    /* + 1 for null-termination */
    if ((nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_NAME) == 0) {
      buflen += nva[i].namelen + 1;
    }
    if ((nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_VALUE) == 0) {
      buflen += nva[i].valuelen + 1;
    }
  }

  buflen += sizeof(nghttp2_nv) * nvlen;

  *nva_ptr = nghttp2_mem_malloc(mem, buflen);

  if (*nva_ptr == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  p = *nva_ptr;
  data = (uint8_t *)(*nva_ptr) + sizeof(nghttp2_nv) * nvlen;

  for (i = 0; i < nvlen; ++i) {
    p->flags = nva[i].flags;

    if (nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_NAME) {
      p->name = nva[i].name;
      p->namelen = nva[i].namelen;
    } else {
      if (nva[i].namelen) {
        memcpy(data, nva[i].name, nva[i].namelen);
      }
      p->name = data;
      p->namelen = nva[i].namelen;
      data[p->namelen] = '\0';
      nghttp2_downcase(p->name, p->namelen);
      data += nva[i].namelen + 1;
    }

    if (nva[i].flags & NGHTTP2_NV_FLAG_NO_COPY_VALUE) {
      p->value = nva[i].value;
      p->valuelen = nva[i].valuelen;
    } else {
      if (nva[i].valuelen) {
        memcpy(data, nva[i].value, nva[i].valuelen);
      }
      p->value = data;
      p->valuelen = nva[i].valuelen;
      data[p->valuelen] = '\0';
      data += nva[i].valuelen + 1;
    }

    ++p;
  }
  return 0;
}